

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O3

void __thiscall
CVmObjClass::CVmObjClass(CVmObjClass *this,int in_root_set,uint meta_idx,vm_obj_id_t self)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *puVar3;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00323668;
  (this->super_CVmObject).ext_ = (char *)0x0;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x20,this);
  puVar3 = (uint *)CONCAT44(extraout_var,iVar2);
  (this->super_CVmObject).ext_ = (char *)puVar3;
  *puVar3 = meta_idx;
  puVar3[1] = 0;
  puVar3[2] = 1;
  puVar3[6] = 0;
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  if (((ulong)uVar1 < G_meta_table_X->count_) && (G_meta_table_X->table_ != (vm_meta_entry_t *)0x0))
  {
    G_meta_table_X->table_[(int)uVar1].class_obj_ = self;
  }
  return;
}

Assistant:

CVmObjClass::CVmObjClass(VMG_ int in_root_set, uint meta_idx,
                         vm_obj_id_t self)
{
    /* calls of this form can't come from the image file */
    assert(!in_root_set);

    /* allocate the extension */
    ext_ = 0;
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* set up the extension */
    ext->meta_idx = meta_idx;
    ext->mod_obj = VM_INVALID_OBJ;
    ext->class_state.set_nil();
    ext->changed = FALSE;

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}